

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_ntlm_core.c
# Opt level: O0

void setup_des_key(uchar *key_56,DES_key_schedule *ks)

{
  uchar local_20 [8];
  DES_cblock key;
  DES_key_schedule *ks_local;
  uchar *key_56_local;
  
  key = (DES_cblock)ks;
  extend_key_56_to_64(key_56,(char *)local_20);
  DES_set_odd_parity(&local_20);
  DES_set_key_unchecked(&local_20,(DES_key_schedule *)key);
  return;
}

Assistant:

static void setup_des_key(const unsigned char *key_56,
                          DES_key_schedule DESKEYARG(ks))
{
  DES_cblock key;

  /* Expand the 56-bit key to 64-bits */
  extend_key_56_to_64(key_56, (char *) &key);

  /* Set the key parity to odd */
  DES_set_odd_parity(&key);

  /* Set the key */
  DES_set_key_unchecked(&key, ks);
}